

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamhdr.c
# Opt level: O0

void nn_streamhdr_init(nn_streamhdr *self,int src,nn_fsm *owner)

{
  nn_fsm *owner_local;
  int src_local;
  nn_streamhdr *self_local;
  
  nn_fsm_init(&self->fsm,nn_streamhdr_handler,nn_streamhdr_shutdown,src,self,owner);
  self->state = 1;
  nn_timer_init(&self->timer,2,&self->fsm);
  nn_fsm_event_init(&self->done);
  self->usock = (nn_usock *)0x0;
  (self->usock_owner).src = -1;
  (self->usock_owner).fsm = (nn_fsm *)0x0;
  self->pipebase = (nn_pipebase *)0x0;
  return;
}

Assistant:

void nn_streamhdr_init (struct nn_streamhdr *self, int src,
    struct nn_fsm *owner)
{
    nn_fsm_init (&self->fsm, nn_streamhdr_handler, nn_streamhdr_shutdown,
        src, self, owner);
    self->state = NN_STREAMHDR_STATE_IDLE;
    nn_timer_init (&self->timer, NN_STREAMHDR_SRC_TIMER, &self->fsm);
    nn_fsm_event_init (&self->done);

    self->usock = NULL;
    self->usock_owner.src = -1;
    self->usock_owner.fsm = NULL;
    self->pipebase = NULL;
}